

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateNewBlock(Arena *this,size_t block_bytes)

{
  long lVar1;
  char *pcVar2;
  ulong in_RSI;
  value_type *in_RDI;
  long in_FS_OFFSET;
  char *result;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (char *)operator_new__(in_RSI);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(in_stack_ffffffffffffffa8,in_RDI);
  LOCK();
  in_RDI[5] = in_RDI[5] + in_RSI + 8;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pcVar2;
}

Assistant:

char* Arena::AllocateNewBlock(size_t block_bytes) {
  char* result = new char[block_bytes];
  blocks_.push_back(result);
  memory_usage_.fetch_add(block_bytes + sizeof(char*),
                          std::memory_order_relaxed);
  return result;
}